

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  bool *location_00;
  string *psVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  option_group_definition *poVar7;
  options_boost_po *this;
  vw_exception *this_00;
  ulong uVar8;
  byte bVar9;
  vw_ostream *pvVar10;
  option_group_definition input_options;
  string data;
  string local_16f0;
  undefined1 *local_16d0 [2];
  undefined1 local_16c0 [16];
  undefined1 *local_16b0 [2];
  undefined1 local_16a0 [16];
  string local_1690;
  undefined1 *local_1670 [2];
  undefined1 local_1660 [16];
  string local_1650;
  undefined1 *local_1630 [2];
  undefined1 local_1620 [16];
  string local_1610;
  undefined1 *local_15f0 [2];
  undefined1 local_15e0 [16];
  string local_15d0;
  undefined1 *local_15b0 [2];
  undefined1 local_15a0 [16];
  undefined1 *local_1590 [2];
  undefined1 local_1580 [16];
  string local_1570;
  undefined1 *local_1550 [2];
  undefined1 local_1540 [16];
  string local_1530;
  undefined1 *local_1510 [2];
  undefined1 local_1500 [16];
  string local_14f0;
  undefined1 *local_14d0 [2];
  undefined1 local_14c0 [16];
  string local_14b0;
  undefined1 *local_1490 [2];
  undefined1 local_1480 [16];
  string local_1470;
  undefined1 *local_1450 [2];
  undefined1 local_1440 [16];
  string local_1430;
  undefined1 *local_1410 [2];
  undefined1 local_1400 [16];
  string local_13f0;
  undefined1 *local_13d0 [2];
  undefined1 local_13c0 [16];
  undefined1 *local_13b0 [2];
  undefined1 local_13a0 [16];
  string local_1390;
  undefined1 *local_1370;
  long local_1368;
  undefined1 local_1360 [16];
  option_group_definition local_1350;
  undefined1 *local_1318 [2];
  undefined1 local_1308 [16];
  string local_12f8;
  undefined1 *local_12d8 [2];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1220;
  undefined1 local_1218 [16];
  undefined1 local_1208 [64];
  string local_11c8 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1180;
  string local_1090;
  undefined1 local_1070 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fe8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_fd8;
  undefined1 local_fd0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f38;
  undefined1 local_f30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ea8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e98;
  undefined1 local_e90 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_df8;
  undefined1 local_df0 [80];
  string local_da0 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d58;
  undefined1 local_d50 [80];
  string local_d00 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_cb8;
  undefined1 local_cb0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c18;
  undefined1 local_c10 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b78;
  undefined1 local_b70 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ae8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_ad8;
  undefined1 local_ad0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a38;
  undefined1 local_a30 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_998;
  undefined1 local_990 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8f8;
  typed_option<bool> local_8f0;
  typed_option<bool> local_850;
  typed_option<bool> local_7b0;
  typed_option<bool> local_710;
  typed_option<bool> local_670;
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  typed_option<bool> local_530;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<bool> local_210;
  typed_option<bool> local_170;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1370 = local_1360;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1370,"Input options","");
  local_1350.m_name._M_dataplus._M_p = (pointer)&local_1350.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1350,local_1370,local_1370 + local_1368);
  local_1350.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1350.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1350.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1370 != local_1360) {
    operator_delete(local_1370);
  }
  local_1390._M_dataplus._M_p = (pointer)&local_1390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1390,"data","");
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1218,&local_1390,location);
  local_13b0[0] = local_13a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13b0,"d","");
  std::__cxx11::string::_M_assign(local_11c8);
  local_13d0[0] = local_13c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13d0,"Example set","");
  std::__cxx11::string::_M_assign((string *)(local_1208 + 0x20));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_d0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1218);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(&local_1350,&local_d0);
  local_13f0._M_dataplus._M_p = (pointer)&local_13f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f0,"daemon","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_12b8,&local_13f0,&__return_storage_ptr__->daemon);
  local_1410[0] = local_1400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1410,"persistent daemon mode on port 26542","");
  std::__cxx11::string::_M_assign((string *)(local_12b8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_170,(typed_option<bool> *)local_12b8);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_170);
  local_1430._M_dataplus._M_p = (pointer)&local_1430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1430,"foreground","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_e90,&local_1430,&__return_storage_ptr__->foreground);
  local_1450[0] = local_1440;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1450,"in persistent daemon mode, do not run in the background","");
  std::__cxx11::string::_M_assign((string *)(local_e90 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_e90);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_210);
  local_1470._M_dataplus._M_p = (pointer)&local_1470.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1470,"port","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_f30,&local_1470,&__return_storage_ptr__->port);
  local_1490[0] = local_1480;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1490,"port to listen on; use 0 to pick unused port","");
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,(typed_option<unsigned_long> *)local_f30);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_2b0);
  local_14b0._M_dataplus._M_p = (pointer)&local_14b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14b0,"num_children","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_fd0,&local_14b0,&all->num_children);
  local_14d0[0] = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"number of children for persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_fd0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_350,(typed_option<unsigned_long> *)local_fd0);
  poVar7 = VW::config::option_group_definition::add<unsigned_long>(poVar7,&local_350);
  local_14f0._M_dataplus._M_p = (pointer)&local_14f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_14f0,"pid_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1070,&local_14f0,&__return_storage_ptr__->pid_file);
  local_1510[0] = local_1500;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1510,"Write pid file in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_1070 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_1070);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_3f0);
  local_1530._M_dataplus._M_p = (pointer)&local_1530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1530,"port_file","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_1530,&__return_storage_ptr__->port_file);
  local_1550[0] = local_1540;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1550,"Write port used in persistent daemon mode","");
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_490,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990);
  poVar7 = VW::config::option_group_definition::add<std::__cxx11::string>(poVar7,&local_490);
  local_1570._M_dataplus._M_p = (pointer)&local_1570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"cache","");
  location_00 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d50,&local_1570,location_00);
  local_1590[0] = local_1580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1590,"c","");
  std::__cxx11::string::_M_assign(local_d00);
  local_15b0[0] = local_15a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15b0,"Use a cache.  The default is <data>.cache","");
  std::__cxx11::string::_M_assign((string *)(local_d50 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_530,(typed_option<bool> *)local_d50);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_530);
  local_15d0._M_dataplus._M_p = (pointer)&local_15d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d0,"cache_file","");
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_a30,&local_15d0,&__return_storage_ptr__->cache_files);
  local_15f0[0] = local_15e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_15f0,"The location(s) of cache_file.","");
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option(&local_5d0,
                 (typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_a30);
  poVar7 = VW::config::option_group_definition::
           add<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     (poVar7,&local_5d0);
  local_1610._M_dataplus._M_p = (pointer)&local_1610.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1610,"json","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_ad0,&local_1610,&__return_storage_ptr__->json);
  local_1630[0] = local_1620;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1630,"Enable JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_ad0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_670,(typed_option<bool> *)local_ad0);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_670);
  local_1650._M_dataplus._M_p = (pointer)&local_1650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1650,"dsjson","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b70,&local_1650,&__return_storage_ptr__->dsjson);
  local_1670[0] = local_1660;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1670,"Enable Decision Service JSON parsing.","");
  std::__cxx11::string::_M_assign((string *)(local_b70 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_710,(typed_option<bool> *)local_b70);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_710);
  local_1690._M_dataplus._M_p = (pointer)&local_1690.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1690,"kill_cache","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_df0,&local_1690,&__return_storage_ptr__->kill_cache);
  local_16b0[0] = local_16a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_16b0,"k","");
  std::__cxx11::string::_M_assign(local_da0);
  local_16d0[0] = local_16c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_16d0,"do not reuse existing cache: create a new one always","");
  std::__cxx11::string::_M_assign((string *)(local_df0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_7b0,(typed_option<bool> *)local_df0);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_7b0);
  local_16f0._M_dataplus._M_p = (pointer)&local_16f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_16f0,"compressed","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_c10,&local_16f0,&__return_storage_ptr__->compressed);
  local_12d8[0] = local_12c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_12d8,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,"");
  std::__cxx11::string::_M_assign((string *)(local_c10 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_850,(typed_option<bool> *)local_c10);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_850);
  local_12f8._M_dataplus._M_p = (pointer)&local_12f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f8,"no_stdin","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_cb0,&local_12f8,&all->stdin_off);
  local_1318[0] = local_1308;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1318,"do not default to reading from stdin","");
  std::__cxx11::string::_M_assign((string *)(local_cb0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_8f0,(typed_option<bool> *)local_cb0);
  VW::config::option_group_definition::add<bool>(poVar7,&local_8f0);
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_8f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_8f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_1318[0] != local_1308) {
    operator_delete(local_1318[0]);
  }
  local_cb0._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_c18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c18._M_pi);
  }
  if (local_c28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c28._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_cb0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f8._M_dataplus._M_p != &local_12f8.field_2) {
    operator_delete(local_12f8._M_dataplus._M_p);
  }
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_12d8[0] != local_12c8) {
    operator_delete(local_12d8[0]);
  }
  local_c10._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_b78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b78._M_pi);
  }
  if (local_b88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b88._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_c10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16f0._M_dataplus._M_p != &local_16f0.field_2) {
    operator_delete(local_16f0._M_dataplus._M_p);
  }
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_16d0[0] != local_16c0) {
    operator_delete(local_16d0[0]);
  }
  if (local_16b0[0] != local_16a0) {
    operator_delete(local_16b0[0]);
  }
  local_df0._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_d58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d58._M_pi);
  }
  if (local_d68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d68._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_df0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1690._M_dataplus._M_p != &local_1690.field_2) {
    operator_delete(local_1690._M_dataplus._M_p);
  }
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_1670[0] != local_1660) {
    operator_delete(local_1670[0]);
  }
  local_b70._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_ad8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ad8._M_pi);
  }
  if (local_ae8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ae8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_b70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1650._M_dataplus._M_p != &local_1650.field_2) {
    operator_delete(local_1650._M_dataplus._M_p);
  }
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1630[0] != local_1620) {
    operator_delete(local_1630[0]);
  }
  local_ad0._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_a38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a38._M_pi);
  }
  if (local_a48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1610._M_dataplus._M_p != &local_1610.field_2) {
    operator_delete(local_1610._M_dataplus._M_p);
  }
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc540;
  if (local_5d0.m_default_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_5d0.m_value.
      super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.
               super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_15f0[0] != local_15e0) {
    operator_delete(local_15f0[0]);
  }
  local_a30._0_8_ = &PTR__typed_option_002cc540;
  if (local_998._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_998._M_pi);
  }
  if (local_9a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_a30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_15d0._M_dataplus._M_p != &local_15d0.field_2) {
    operator_delete(local_15d0._M_dataplus._M_p);
  }
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_15b0[0] != local_15a0) {
    operator_delete(local_15b0[0]);
  }
  if (local_1590[0] != local_1580) {
    operator_delete(local_1590[0]);
  }
  local_d50._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_cb8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cb8._M_pi);
  }
  if (local_cc8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_cc8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1570._M_dataplus._M_p != &local_1570.field_2) {
    operator_delete(local_1570._M_dataplus._M_p);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_490.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_490.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1550[0] != local_1540) {
    operator_delete(local_1550[0]);
  }
  local_990._0_8_ = &PTR__typed_option_002cc008;
  if (local_8f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8f8._M_pi);
  }
  if (local_908._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_908._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_990);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
    operator_delete(local_1530._M_dataplus._M_p);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_3f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_1510[0] != local_1500) {
    operator_delete(local_1510[0]);
  }
  local_1070._0_8_ = &PTR__typed_option_002cc008;
  if (local_fd8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fd8._M_pi);
  }
  if (local_fe8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fe8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1070);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
    operator_delete(local_14f0._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_14d0[0] != local_14c0) {
    operator_delete(local_14d0[0]);
  }
  local_fd0._0_8_ = &PTR__typed_option_002cbf30;
  if (local_f38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f38._M_pi);
  }
  if (local_f48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_fd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14b0._M_dataplus._M_p != &local_14b0.field_2) {
    operator_delete(local_14b0._M_dataplus._M_p);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_1490[0] != local_1480) {
    operator_delete(local_1490[0]);
  }
  local_f30._0_8_ = &PTR__typed_option_002cbf30;
  if (local_e98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e98._M_pi);
  }
  if (local_ea8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_ea8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_f30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1470._M_dataplus._M_p != &local_1470.field_2) {
    operator_delete(local_1470._M_dataplus._M_p);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_1450[0] != local_1440) {
    operator_delete(local_1450[0]);
  }
  local_e90._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_df8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_df8._M_pi);
  }
  if (local_e08._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e08._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_e90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1430._M_dataplus._M_p != &local_1430.field_2) {
    operator_delete(local_1430._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_1410[0] != local_1400) {
    operator_delete(local_1410[0]);
  }
  local_12b8._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_1220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1220._M_pi);
  }
  if (local_1230._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1230._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_12b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f0._M_dataplus._M_p != &local_13f0.field_2) {
    operator_delete(local_13f0._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_d0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_13d0[0] != local_13c0) {
    operator_delete(local_13d0[0]);
  }
  if (local_13b0[0] != local_13a0) {
    operator_delete(local_13b0[0]);
  }
  local_1218._0_8_ = &PTR__typed_option_002cc008;
  if (local_1180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1180._M_pi);
  }
  if (local_1190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1190._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_1218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
    operator_delete(local_1390._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1350);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo);
  if (this != (options_boost_po *)0x0) {
    local_1218._8_8_ = (string *)0x0;
    local_1208[0] = '\0';
    local_12b8._0_8_ = local_12b8 + 0x10;
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"data","");
    bVar4 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_12b8,(string *)local_1218,-1);
    if ((undefined1 *)local_12b8._0_8_ != local_12b8 + 0x10) {
      operator_delete((void *)local_12b8._0_8_);
    }
    if (bVar4) {
      psVar1 = (string *)(all->data_filename)._M_string_length;
      if (psVar1 == (string *)local_1218._8_8_) {
        if (psVar1 != (string *)0x0) {
          iVar6 = bcmp((location->_M_dataplus)._M_p,(void *)local_1218._0_8_,(size_t)psVar1);
          if (iVar6 != 0) goto LAB_00146237;
        }
      }
      else {
LAB_00146237:
        std::__cxx11::string::_M_assign((string *)location);
      }
    }
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
  }
  bVar4 = __return_storage_ptr__->daemon;
  bVar9 = 1;
  if (bVar4 == false) {
    local_12b8._0_8_ = local_12b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_12b8,"pid_file","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_12b8);
    if ((char)iVar6 != '\0') goto LAB_001462a7;
    local_e90._0_8_ = local_e90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e90,"port","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_e90);
    bVar3 = true;
    if ((char)iVar6 == '\0') {
      bVar9 = 0;
    }
    else {
      bVar9 = all->active ^ 1;
    }
  }
  else {
LAB_001462a7:
    bVar3 = false;
  }
  if ((bVar3) && ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10)) {
    operator_delete((void *)local_e90._0_8_);
  }
  if ((bVar4 == false) && ((undefined1 *)local_12b8._0_8_ != local_12b8 + 0x10)) {
    operator_delete((void *)local_12b8._0_8_);
  }
  if (bVar9 != 0) {
    all->daemon = true;
    all->numpasses = 100000;
  }
  if (*location_00 == true) {
    pcVar2 = (all->data_filename)._M_dataplus._M_p;
    local_1218._0_8_ = local_1208;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1218,pcVar2,pcVar2 + (all->data_filename)._M_string_length);
    std::__cxx11::string::append(local_1218);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->cache_files,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1218);
    if ((undefined1 *)local_1218._0_8_ != local_1208) {
      operator_delete((void *)local_1218._0_8_);
    }
  }
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  local_1218._0_8_ = local_1208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1218,".gz","");
  psVar1 = (string *)(all->data_filename)._M_string_length;
  uVar8 = (long)psVar1 - local_1218._8_8_;
  if (psVar1 < (ulong)local_1218._8_8_ || uVar8 == 0) {
    bVar4 = false;
  }
  else {
    iVar6 = std::__cxx11::string::compare((ulong)location,uVar8,(string *)local_1218._8_8_);
    bVar4 = iVar6 == 0;
  }
  if ((undefined1 *)local_1218._0_8_ != local_1208) {
    operator_delete((void *)local_1218._0_8_);
  }
  if (bVar4) {
    set_compressed(all->p);
  }
  bVar4 = *location_00;
  if (bVar4 == false) {
    local_f30._0_8_ = local_f30 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f30,"cache_file","");
    iVar6 = (*options->_vptr_options_i[1])(options,local_f30);
    if ((char)iVar6 == '\0') {
      bVar9 = 1;
      bVar4 = false;
      cVar5 = '\0';
      goto LAB_001464d5;
    }
  }
  bVar9 = bVar4 ^ 1;
  local_fd0._0_8_ = local_fd0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_fd0,"invert_hash","");
  iVar6 = (*options->_vptr_options_i[1])(options,local_fd0);
  cVar5 = (char)iVar6;
  bVar4 = true;
LAB_001464d5:
  if ((bVar4) && ((undefined1 *)local_fd0._0_8_ != local_fd0 + 0x10)) {
    operator_delete((void *)local_fd0._0_8_);
  }
  if ((bVar9 != 0) && ((undefined1 *)local_f30._0_8_ != local_f30 + 0x10)) {
    operator_delete((void *)local_f30._0_8_);
  }
  if (cVar5 == '\0') {
    bVar4 = all->holdout_set_off;
    if (bVar4 == false) {
      local_1218._0_8_ = local_1208;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1218,"output_feature_regularizer_binary","");
      iVar6 = (*options->_vptr_options_i[1])(options,local_1218);
      if ((char)iVar6 == '\0') {
        local_1070._0_8_ = local_1070 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1070,"output_feature_regularizer_text","");
        iVar6 = (*options->_vptr_options_i[1])(options,local_1070);
        cVar5 = (char)iVar6;
        bVar3 = true;
      }
      else {
        cVar5 = '\x01';
        bVar3 = false;
      }
    }
    else {
      bVar3 = false;
      cVar5 = '\0';
    }
    if ((bVar3) && ((undefined1 *)local_1070._0_8_ != local_1070 + 0x10)) {
      operator_delete((void *)local_1070._0_8_);
    }
    if ((bVar4 == false) && ((undefined1 *)local_1218._0_8_ != local_1208)) {
      operator_delete((void *)local_1218._0_8_);
    }
    if (cVar5 != '\0') {
      all->holdout_set_off = true;
      pvVar10 = &all->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar10->super_ostream,
                 "Making holdout_set_off=true since output regularizer specified",0x3e);
      std::ios::widen((char)(pvVar10->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar10);
      std::ostream::put((char)pvVar10);
      std::ostream::flush();
    }
    std::
    vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
    ::~vector(&local_1350.m_options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1350.m_name._M_dataplus._M_p != &local_1350.m_name.field_2) {
      operator_delete(local_1350.m_name._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1218);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1208,
             "invert_hash is incompatible with a cache file.  Use it in single pass mode only.",0x50
            );
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
             ,0x1d5,&local_1090);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}